

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qerrormessage.cpp
# Opt level: O0

bool __thiscall QErrorMessagePrivate::nextPending(QErrorMessagePrivate *this)

{
  long lVar1;
  bool bVar2;
  QString *in_RDI;
  long in_FS_OFFSET;
  QString type;
  QString message;
  QString *in_stack_ffffffffffffff98;
  undefined7 in_stack_ffffffffffffffa0;
  undefined1 in_stack_ffffffffffffffa7;
  undefined4 in_stack_ffffffffffffffb0;
  undefined4 in_stack_ffffffffffffffb4;
  uint uVar3;
  QString *message_00;
  undefined7 in_stack_ffffffffffffffc0;
  byte in_stack_ffffffffffffffc7;
  
  lVar1 = *(long *)(in_FS_OFFSET + 0x28);
  message_00 = in_RDI;
  while (bVar2 = std::
                 queue<QErrorMessagePrivate::Message,_std::deque<QErrorMessagePrivate::Message,_std::allocator<QErrorMessagePrivate::Message>_>_>
                 ::empty((queue<QErrorMessagePrivate::Message,_std::deque<QErrorMessagePrivate::Message,_std::allocator<QErrorMessagePrivate::Message>_>_>
                          *)0x7488c6), ((bVar2 ^ 0xffU) & 1) != 0) {
    std::
    queue<QErrorMessagePrivate::Message,_std::deque<QErrorMessagePrivate::Message,_std::allocator<QErrorMessagePrivate::Message>_>_>
    ::front((queue<QErrorMessagePrivate::Message,_std::deque<QErrorMessagePrivate::Message,_std::allocator<QErrorMessagePrivate::Message>_>_>
             *)CONCAT17(in_stack_ffffffffffffffa7,in_stack_ffffffffffffffa0));
    QString::QString((QString *)CONCAT17(in_stack_ffffffffffffffa7,in_stack_ffffffffffffffa0),
                     in_stack_ffffffffffffff98);
    std::
    queue<QErrorMessagePrivate::Message,_std::deque<QErrorMessagePrivate::Message,_std::allocator<QErrorMessagePrivate::Message>_>_>
    ::front((queue<QErrorMessagePrivate::Message,_std::deque<QErrorMessagePrivate::Message,_std::allocator<QErrorMessagePrivate::Message>_>_>
             *)CONCAT17(in_stack_ffffffffffffffa7,in_stack_ffffffffffffffa0));
    QString::QString((QString *)CONCAT17(in_stack_ffffffffffffffa7,in_stack_ffffffffffffffa0),
                     in_stack_ffffffffffffff98);
    std::
    queue<QErrorMessagePrivate::Message,_std::deque<QErrorMessagePrivate::Message,_std::allocator<QErrorMessagePrivate::Message>_>_>
    ::pop((queue<QErrorMessagePrivate::Message,_std::deque<QErrorMessagePrivate::Message,_std::allocator<QErrorMessagePrivate::Message>_>_>
           *)CONCAT17(in_stack_ffffffffffffffa7,in_stack_ffffffffffffffa0));
    bVar2 = isMessageToBeShown((QErrorMessagePrivate *)
                               CONCAT17(in_stack_ffffffffffffffc7,in_stack_ffffffffffffffc0),
                               message_00,
                               (QString *)
                               CONCAT44(in_stack_ffffffffffffffb4,in_stack_ffffffffffffffb0));
    if (bVar2) {
      QTextEdit::setHtml((QTextEdit *)CONCAT17(in_stack_ffffffffffffffa7,in_stack_ffffffffffffffa0),
                         in_stack_ffffffffffffff98);
      QString::operator=((QString *)CONCAT17(in_stack_ffffffffffffffa7,in_stack_ffffffffffffffa0),
                         in_stack_ffffffffffffff98);
      QString::operator=((QString *)CONCAT17(in_stack_ffffffffffffffa7,in_stack_ffffffffffffffa0),
                         in_stack_ffffffffffffff98);
      QAbstractButton::setChecked
                ((QAbstractButton *)CONCAT44(in_stack_ffffffffffffffb4,in_stack_ffffffffffffffb0),
                 SUB81((ulong)in_RDI >> 0x38,0));
      in_stack_ffffffffffffffc7 = 1;
    }
    uVar3 = (uint)bVar2;
    QString::~QString((QString *)0x7489fd);
    QString::~QString((QString *)0x748a07);
    if (uVar3 != 0) goto LAB_00748a1d;
    in_stack_ffffffffffffffb4 = 0;
  }
  in_stack_ffffffffffffffc7 = 0;
LAB_00748a1d:
  if (*(long *)(in_FS_OFFSET + 0x28) != lVar1) {
    __stack_chk_fail();
  }
  return (bool)(in_stack_ffffffffffffffc7 & 1);
}

Assistant:

bool QErrorMessagePrivate::nextPending()
{
    while (!pending.empty()) {
        QString message = std::move(pending.front().content);
        QString type = std::move(pending.front().type);
        pending.pop();
        if (isMessageToBeShown(message, type)) {
#ifndef QT_NO_TEXTHTMLPARSER
            errors->setHtml(message);
#else
            errors->setPlainText(message);
#endif
            currentMessage = std::move(message);
            currentType = std::move(type);
            again->setChecked(true);
            return true;
        }
    }
    return false;
}